

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::Key(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
      *this,Context *context,Ch *str,SizeType len,bool param_4)

{
  uint uVar1;
  RegexType *pattern;
  bool bVar2;
  SchemaType *pSVar3;
  ValueType *this_00;
  Ch *pCVar4;
  long lVar5;
  SizeType i;
  ulong uVar6;
  SizeType index;
  SizeType local_44;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_40;
  
  if (this->patternProperties_ != (PatternProperty *)0x0) {
    context->patternPropertiesSchemaCount = 0;
    lVar5 = 0;
    for (uVar6 = 0; uVar6 < this->patternPropertyCount_; uVar6 = uVar6 + 1) {
      pattern = *(RegexType **)((long)&this->patternProperties_->pattern + lVar5);
      if ((pattern != (RegexType *)0x0) && (bVar2 = IsPatternMatch(pattern,str,len), bVar2)) {
        pSVar3 = *(SchemaType **)((long)&this->patternProperties_->schema + lVar5);
        uVar1 = context->patternPropertiesSchemaCount;
        context->patternPropertiesSchemaCount = uVar1 + 1;
        context->patternPropertiesSchemas[uVar1] = pSVar3;
        context->valueSchema = this->typeless_;
      }
      lVar5 = lVar5 + 0x10;
    }
  }
  local_44 = 0;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(&local_40,str,len);
  bVar2 = FindPropertyIndex(this,&local_40,&local_44);
  if (!bVar2) {
    pSVar3 = this->additionalPropertiesSchema_;
    if (pSVar3 == (SchemaType *)0x0) {
      if (this->additionalProperties_ != true) {
        if (context->patternPropertiesSchemaCount == 0) {
          context->valueSchema = this->typeless_;
          (*context->error_handler->_vptr_IValidationErrorHandler[0x18])
                    (context->error_handler,str,(ulong)len);
          context->invalidCode = kValidateErrorAdditionalProperties;
          this_00 = GetAdditionalPropertiesString();
          pCVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(this_00);
          context->invalidKeyword = pCVar4;
          return false;
        }
        return true;
      }
      pSVar3 = this->typeless_;
    }
    else {
      uVar1 = context->patternPropertiesSchemaCount;
      if ((ulong)uVar1 != 0) {
        context->patternPropertiesSchemaCount = uVar1 + 1;
        context->patternPropertiesSchemas[uVar1] = pSVar3;
        context->valueSchema = this->typeless_;
        context->valuePatternValidatorType = kPatternValidatorWithAdditionalProperty;
        return true;
      }
    }
    context->valueSchema = pSVar3;
    return true;
  }
  uVar1 = context->patternPropertiesSchemaCount;
  pSVar3 = this->properties_[local_44].schema;
  if ((ulong)uVar1 != 0) {
    context->patternPropertiesSchemaCount = uVar1 + 1;
    context->patternPropertiesSchemas[uVar1] = pSVar3;
    pSVar3 = this->typeless_;
    context->valuePatternValidatorType = kPatternValidatorWithProperty;
  }
  context->valueSchema = pSVar3;
  if (context->propertyExist != (bool *)0x0) {
    context->propertyExist[local_44] = true;
    return true;
  }
  return true;
}

Assistant:

bool Key(Context& context, const Ch* str, SizeType len, bool) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::Key", str);

        if (patternProperties_) {
            context.patternPropertiesSchemaCount = 0;
            for (SizeType i = 0; i < patternPropertyCount_; i++)
                if (patternProperties_[i].pattern && IsPatternMatch(patternProperties_[i].pattern, str, len)) {
                    context.patternPropertiesSchemas[context.patternPropertiesSchemaCount++] = patternProperties_[i].schema;
                    context.valueSchema = typeless_;
                }
        }

        SizeType index  = 0;
        if (FindPropertyIndex(ValueType(str, len).Move(), &index)) {
            if (context.patternPropertiesSchemaCount > 0) {
                context.patternPropertiesSchemas[context.patternPropertiesSchemaCount++] = properties_[index].schema;
                context.valueSchema = typeless_;
                context.valuePatternValidatorType = Context::kPatternValidatorWithProperty;
            }
            else
                context.valueSchema = properties_[index].schema;

            if (context.propertyExist)
                context.propertyExist[index] = true;

            return true;
        }

        if (additionalPropertiesSchema_) {
            if (context.patternPropertiesSchemaCount > 0) {
                context.patternPropertiesSchemas[context.patternPropertiesSchemaCount++] = additionalPropertiesSchema_;
                context.valueSchema = typeless_;
                context.valuePatternValidatorType = Context::kPatternValidatorWithAdditionalProperty;
            }
            else
                context.valueSchema = additionalPropertiesSchema_;
            return true;
        }
        else if (additionalProperties_) {
            context.valueSchema = typeless_;
            return true;
        }

        if (context.patternPropertiesSchemaCount == 0) { // patternProperties are not additional properties
            // Must set valueSchema for when kValidateContinueOnErrorFlag is set, else reports spurious type error
            context.valueSchema = typeless_;
            context.error_handler.DisallowedProperty(str, len);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorAdditionalProperties);
        }

        return true;
    }